

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O2

int run_test_udp_send_immediate(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_6;
  int64_t eval_b_7;
  sockaddr_in addr;
  uv_buf_t local_2a8;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  req1.data = (void *)(long)iVar1;
  req2.data = (void *)0x0;
  if (req1.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    req1.data = (void *)(long)iVar1;
    req2.data = (void *)0x0;
    if (req1.data == (void *)0x0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      req1.data = (void *)(long)iVar1;
      req2.data = (void *)0x0;
      if (req1.data == (void *)0x0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        req1.data = (void *)(long)iVar1;
        req2.data = (void *)0x0;
        if (req1.data == (void *)0x0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          req1.data = (void *)(long)iVar1;
          req2.data = (void *)0x0;
          if (req1.data == (void *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            req1.data = (void *)(long)iVar1;
            req2.data = (void *)0x0;
            if (req1.data == (void *)0x0) {
              local_2a8 = uv_buf_init("PING",4);
              iVar1 = uv_udp_send(&req1,&client,&local_2a8,1,(sockaddr *)&addr,cl_send_cb);
              req2.data = (void *)(long)iVar1;
              if (req2.data == (void *)0x0) {
                local_2a8 = uv_buf_init("PANG",4);
                iVar1 = uv_udp_send(&req2,&client,&local_2a8,1,(sockaddr *)&addr,cl_send_cb);
                eval_b_6 = (int64_t)iVar1;
                eval_b_7 = 0;
                if ((void *)eval_b_6 == (void *)0x0) {
                  puVar2 = uv_default_loop();
                  uv_run(puVar2,UV_RUN_DEFAULT);
                  eval_b_6 = 2;
                  eval_b_7 = (int64_t)cl_send_cb_called;
                  if (eval_b_7 == 2) {
                    eval_b_6 = 2;
                    eval_b_7 = (int64_t)sv_recv_cb_called;
                    if (eval_b_7 == 2) {
                      eval_b_6 = 2;
                      eval_b_7 = (int64_t)close_cb_called;
                      if (eval_b_7 == 2) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        eval_b_6 = 0;
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        eval_b_7 = (int64_t)iVar1;
                        if (eval_b_7 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar5 = "uv_loop_close(uv_default_loop())";
                        pcVar4 = "0";
                        uVar3 = 0x92;
                      }
                      else {
                        pcVar5 = "close_cb_called";
                        pcVar4 = "2";
                        uVar3 = 0x90;
                      }
                    }
                    else {
                      pcVar5 = "sv_recv_cb_called";
                      pcVar4 = "2";
                      uVar3 = 0x8f;
                    }
                  }
                  else {
                    pcVar5 = "cl_send_cb_called";
                    pcVar4 = "2";
                    uVar3 = 0x8e;
                  }
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "r";
                  uVar3 = 0x8a;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "r";
                uVar3 = 0x80;
                eval_b_7 = 0;
                eval_b_6 = (int64_t)req2.data;
              }
              goto LAB_001aa71e;
            }
            pcVar4 = "r";
            uVar3 = 0x75;
          }
          else {
            pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
            uVar3 = 0x72;
          }
        }
        else {
          pcVar4 = "r";
          uVar3 = 0x70;
        }
      }
      else {
        pcVar4 = "r";
        uVar3 = 0x6d;
      }
    }
    else {
      pcVar4 = "r";
      uVar3 = 0x6a;
    }
  }
  else {
    pcVar4 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar3 = 0x67;
  }
  req2.data = (void *)0x0;
  pcVar5 = "0";
  eval_b_7 = 0;
  eval_b_6 = (int64_t)req1.data;
LAB_001aa71e:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-immediate.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b_6,"==",eval_b_7);
  abort();
}

Assistant:

TEST_IMPL(udp_send_immediate) {
  struct sockaddr_in addr;
  uv_udp_send_t req1, req2;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_send_cb_called);
  ASSERT_EQ(2, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}